

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

Stream * __thiscall kratos::Stream::operator<<(Stream *this,AssignStmt *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  StmtException *pSVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint64_t i;
  ulong uVar6;
  long lVar7;
  string_view sVar8;
  basic_string_view<char> bVar9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  size_type *local_110;
  string eq;
  anon_class_8_1_8991fb9c var_str_func;
  undefined1 auStack_d8 [8];
  string left;
  string right;
  string prefix;
  anon_class_16_2_0738fce5 output_delay;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  right_wrapped;
  allocator_type local_32;
  allocator_type local_31;
  
  var_str_abi_cxx11_((string *)auStack_d8,this,stmt->left_);
  var_str_abi_cxx11_((string *)((long)&left.field_2 + 8),this,stmt->right_);
  if ((stmt->super_Stmt).super_IRNode.comment._M_string_length != 0) {
    puVar1 = &(this->super_stringstream).field_0x10;
    poVar4 = std::operator<<((ostream *)puVar1,"// ");
    strip_newline((string *)auStack_58,&(stmt->super_Stmt).super_IRNode.comment);
    poVar4 = std::operator<<(poVar4,(string *)auStack_58);
    puVar2 = &(this->super_stringstream).field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)auStack_58);
    sVar8 = SystemVerilogCodeGen::indent
                      (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,sVar8._M_str,sVar8._M_len);
  }
  if (*(char *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) == '\x01') {
    (stmt->super_Stmt).super_IRNode.verilog_ln = *(uint32_t *)&(this->super_stringstream).field_0x90
    ;
  }
  right.field_2._8_8_ = &prefix._M_string_length;
  prefix._M_dataplus._M_p = (pointer)0x0;
  local_110 = &eq._M_string_length;
  eq._M_dataplus._M_p = (pointer)0x0;
  prefix._M_string_length._0_1_ = 0;
  eq._M_string_length._0_1_ = 0;
  iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[4])(stmt);
  if (CONCAT44(extraout_var,iVar3) == *(long *)&(this->super_stringstream).field_0x80) {
    if (stmt->assign_type_ != Blocking) {
      pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
      right_wrapped.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)left.field_2._8_8_;
      right_wrapped.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)right._M_dataplus._M_p;
      bVar9 = fmt::v7::to_string_view<char,_0>
                        ("Top level assignment for {0} <- {1} has to be blocking");
      format_str.data_ = (char *)bVar9.size_;
      format_str.size_ = 0xdd;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)((long)&prefix.field_2 + 8),(detail *)bVar9.data_,format_str,args);
      eq.field_2._8_8_ = stmt->left_;
      __l._M_len = 3;
      __l._M_array = (iterator)((long)&eq.field_2 + 8);
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l,
                 &local_31);
      StmtException::StmtException
                (pSVar5,(string *)((long)&prefix.field_2 + 8),
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
      __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
        super__Optional_payload_base<kratos::EventControl>._M_engaged == true) {
      pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_58,"Continuous assignment cannot have delay",
                 (allocator<char> *)&local_31);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)((long)&eq.field_2 + 8);
      eq.field_2._8_8_ = stmt;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                 ((long)&prefix.field_2 + 8),__l_00,&local_32);
      StmtException::StmtException
                (pSVar5,(string *)auStack_58,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                 ((long)&prefix.field_2 + 8));
      __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign(right.field_2._M_local_buf + 8);
  }
  else {
    _auStack_58 = SystemVerilogCodeGen::indent
                            (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)(right.field_2._M_local_buf + 8),
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58);
    if ((stmt->assign_type_ != Blocking) && (stmt->assign_type_ != NonBlocking)) {
      pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
      right_wrapped.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)left.field_2._8_8_;
      right_wrapped.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)right._M_dataplus._M_p;
      bVar9 = fmt::v7::to_string_view<char,_0>
                        ("Top level assignment for {0} <- {1} has to be blocking");
      format_str_00.data_ = (char *)bVar9.size_;
      format_str_00.size_ = 0xdd;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)((long)&prefix.field_2 + 8),(detail *)bVar9.data_,format_str_00,args_00);
      eq.field_2._8_8_ = stmt->left_;
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)((long)&eq.field_2 + 8);
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l_01,
                 &local_31);
      StmtException::StmtException
                (pSVar5,(string *)((long)&prefix.field_2 + 8),
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
      __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::assign((char *)&local_110);
  puVar1 = &(this->super_stringstream).field_0x10;
  std::operator<<((ostream *)puVar1,(string *)(right.field_2._M_local_buf + 8));
  eq.field_2._8_8_ = this;
  prefix.field_2._8_8_ = this;
  if (((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
       super__Optional_payload_base<kratos::EventControl>._M_engaged == true) &&
     ((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
      super__Optional_payload_base<kratos::EventControl>._M_payload._M_value.delay_side == left)) {
    operator<<::anon_class_16_2_0738fce5::operator()
              ((anon_class_16_2_0738fce5 *)((long)&prefix.field_2 + 8),(EventControl *)&stmt->delay_
              );
  }
  poVar4 = std::operator<<((ostream *)puVar1,(string *)auStack_d8);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)&local_110);
  std::operator<<(poVar4," ");
  if (((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
       super__Optional_payload_base<kratos::EventControl>._M_engaged == true) &&
     ((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
      super__Optional_payload_base<kratos::EventControl>._M_payload._M_value.delay_side == right)) {
    operator<<::anon_class_16_2_0738fce5::operator()
              ((anon_class_16_2_0738fce5 *)((long)&prefix.field_2 + 8),(EventControl *)&stmt->delay_
              );
  }
  line_wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_58,(string *)((long)&left.field_2 + 8),
            *(uint32_t *)(*(long *)&(this->super_stringstream).field_0x88 + 0xb8));
  std::operator<<((ostream *)puVar1,(string *)auStack_58);
  uVar6 = 1;
  lVar7 = 0x20;
  while( true ) {
    if ((ulong)((long)right_wrapped.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 5) <= uVar6)
    break;
    puVar2 = &(this->super_stringstream).field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    std::operator<<((ostream *)puVar1,'\n');
    sVar8 = SystemVerilogCodeGen::indent
                      (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar8._M_str,sVar8._M_len);
    poVar4 = std::operator<<(poVar4,"    ");
    std::operator<<(poVar4,(string *)((long)auStack_58 + lVar7));
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x20;
  }
  poVar4 = std::operator<<((ostream *)puVar1,";");
  puVar1 = &(this->super_stringstream).field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar4,'\n');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_58);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)(right.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(left.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)auStack_d8);
  return this;
}

Assistant:

Stream& Stream::operator<<(AssignStmt* stmt) {
    const auto left = var_str(stmt->left());
    const auto right = var_str(stmt->right());
    if (!stmt->comment.empty()) {
        (*this) << "// " << strip_newline(stmt->comment) << endl();
        (*this) << codegen_->indent();
    }

    if (generator_->debug) {
        stmt->verilog_ln = line_no_;
    }

    std::string prefix;
    std::string eq;

    if (stmt->parent() == generator_) {
        // top level
        if (stmt->assign_type() != AssignmentType::Blocking)
            throw StmtException(
                ::format("Top level assignment for {0} <- {1} has to be blocking", left, right),
                {stmt->left(), stmt->right(), stmt});
        if (stmt->has_delay()) {
            throw StmtException("Continuous assignment cannot have delay", {stmt});
        }
        prefix = "assign ";
        eq = "=";
    } else {
        prefix = codegen_->indent();
        if (stmt->assign_type() == AssignmentType::Blocking)
            eq = "=";
        else if (stmt->assign_type() == AssignmentType::NonBlocking)
            eq = "<=";
        else
            throw StmtException(
                ::format("Top level assignment for {0} <- {1} has to be blocking", left, right),
                {stmt->left(), stmt->right(), stmt});
    }

    (*this) << prefix;
    auto var_str_func = [this](const Var* v) { return var_str(v); };
    auto output_delay = [this, &var_str_func](const EventControl& e) {
        switch (e.type) {
            case EventControlType::Delay: {
                (*this) << e.to_string(var_str_func) << ' ';
                break;
            }
            case EventControlType::Edge: {
                (*this) << "@(" << e.to_string(var_str_func) << ") ";
            }
        }
    };
    // lhs delay
    if (stmt->has_delay() && stmt->get_delay()->delay_side == EventControl::DelaySide::left) {
        // this is a lhs delay
        output_delay(*stmt->get_delay());
    }

    (*this) << left << " " << eq << " ";  //<< right << ";" << endl();

    // rhs delay
    if (stmt->has_delay() && stmt->get_delay()->delay_side == EventControl::DelaySide::right) {
        // this is a rhs delay
        output_delay(*stmt->get_delay());
    }

    auto right_wrapped = line_wrap(right, codegen_->options().line_wrap);
    (*this) << right_wrapped[0];
    for (uint64_t i = 1; i < right_wrapped.size(); i++) {
        // compute new indent
        (*this) << endl();
        (*this) << codegen_->indent() << "    " << right_wrapped[i];
    }
    (*this) << ";" << endl();
    return *this;
}